

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accel.h
# Opt level: O1

void __thiscall embree::Accel::Intersectors::print(Intersectors *this,size_t ident)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  
  if ((this->collider).name != (char *)0x0) {
    sVar3 = ident;
    if (ident != 0) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"collider  = ",0xc);
    pcVar1 = (this->collider).name;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x22511f8);
    }
    else {
      sVar2 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  if ((this->intersector1).name != (char *)0x0) {
    sVar3 = ident;
    if (ident != 0) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"intersector1  = ",0x10);
    pcVar1 = (this->intersector1).name;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x22511f8);
    }
    else {
      sVar2 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  if ((this->intersector4).name != (char *)0x0) {
    sVar3 = ident;
    if (ident != 0) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"intersector4  = ",0x10);
    pcVar1 = (this->intersector4).name;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x22511f8);
    }
    else {
      sVar2 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  if ((this->intersector8).name != (char *)0x0) {
    sVar3 = ident;
    if (ident != 0) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"intersector8  = ",0x10);
    pcVar1 = (this->intersector8).name;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x22511f8);
    }
    else {
      sVar2 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  if ((this->intersector16).name == (char *)0x0) {
    return;
  }
  if (ident != 0) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      ident = ident - 1;
    } while (ident != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"intersector16 = ",0x10);
  pcVar1 = (this->intersector16).name;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x22511f8);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  return;
}

Assistant:

void print(size_t ident) 
      {
        if (collider.name) {
          for (size_t i=0; i<ident; i++) std::cout << " ";
          std::cout << "collider  = " << collider.name << std::endl;
        }
        if (intersector1.name) {
          for (size_t i=0; i<ident; i++) std::cout << " ";
          std::cout << "intersector1  = " << intersector1.name << std::endl;
        }
        if (intersector4.name) {
          for (size_t i=0; i<ident; i++) std::cout << " ";
          std::cout << "intersector4  = " << intersector4.name << std::endl;
        }
        if (intersector8.name) {
          for (size_t i=0; i<ident; i++) std::cout << " ";
          std::cout << "intersector8  = " << intersector8.name << std::endl;
        }
        if (intersector16.name) {
          for (size_t i=0; i<ident; i++) std::cout << " ";
          std::cout << "intersector16 = " << intersector16.name << std::endl;
        }
      }